

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

void tree_sitter_bash_external_scanner_destroy(void *payload)

{
  long lVar1;
  void *__ptr;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar2 = (ulong)*(uint *)((long)payload + 0x10);
  if (*(uint *)((long)payload + 0x10) != 0) {
    lVar3 = 0x18;
    uVar4 = 0;
    do {
      if ((uint)uVar2 <= (uint)uVar4) {
        __assert_fail("(uint32_t)(i) < (&scanner->heredocs)->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/tree-sitter[P]tree-sitter-bash/src/scanner.c"
                      ,0x4bb,"void tree_sitter_bash_external_scanner_destroy(void *)");
      }
      lVar1 = *(long *)((long)payload + 8);
      if (*(void **)(lVar1 + lVar3) != (void *)0x0) {
        free(*(void **)(lVar1 + lVar3));
        *(undefined8 *)(lVar1 + lVar3) = 0;
        ((undefined8 *)(lVar1 + lVar3))[1] = 0;
      }
      __ptr = *(void **)(lVar1 + -0x10 + lVar3);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)(lVar1 + lVar3 + -0x10) = 0;
        *(undefined8 *)(lVar1 + lVar3 + -8) = 0;
      }
      uVar4 = uVar4 + 1;
      uVar2 = (ulong)*(uint *)((long)payload + 0x10);
      lVar3 = lVar3 + 0x28;
    } while (uVar4 < uVar2);
  }
  if (*(void **)((long)payload + 8) != (void *)0x0) {
    free(*(void **)((long)payload + 8));
  }
  free(payload);
  return;
}

Assistant:

void tree_sitter_bash_external_scanner_destroy(void *payload) {
    Scanner *scanner = (Scanner *)payload;
    for (size_t i = 0; i < scanner->heredocs.size; i++) {
        Heredoc *heredoc = array_get(&scanner->heredocs, i);
        array_delete(&heredoc->current_leading_word);
        array_delete(&heredoc->delimiter);
    }
    array_delete(&scanner->heredocs);
    free(scanner);
}